

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_bitswap(DisasContext_conflict6 *ctx,int opc,int rd,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rd_local;
  int opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rt);
    if (opc == 0x7c000020) {
      gen_helper_bitswap(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t);
    }
    else if (opc == 0x7c000024) {
      gen_helper_dbitswap(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t);
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_bitswap(DisasContext *ctx, int opc, int rd, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    switch (opc) {
    case OPC_BITSWAP:
        gen_helper_bitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DBITSWAP:
        gen_helper_dbitswap(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}